

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

void __thiscall
dxil_spv::Converter::Impl::decorate_physical_offsets
          (Impl *this,Id struct_type_id,Vector<spv::Id> *type_ids)

{
  Id *pIVar1;
  SizeAlignment SVar2;
  Builder *this_00;
  uint member;
  uint num;
  int iVar3;
  Id *pIVar4;
  
  pIVar4 = (type_ids->
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pIVar1 = (type_ids->
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  member = 0;
  iVar3 = 0;
  while( true ) {
    if (pIVar4 == pIVar1) {
      return;
    }
    SVar2 = get_physical_size_for_type(this,*pIVar4);
    if (SVar2.size == 0) break;
    num = -SVar2.alignment & (iVar3 + SVar2.alignment) - 1;
    this_00 = builder(this);
    spv::Builder::addMemberDecoration(this_00,struct_type_id,member,DecorationOffset,num);
    iVar3 = num + SVar2.size;
    member = member + 1;
    pIVar4 = pIVar4 + 1;
  }
  __assert_fail("size_alignment.size != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/dxil_converter.cpp"
                ,0xeb7,
                "void dxil_spv::Converter::Impl::decorate_physical_offsets(spv::Id, const Vector<spv::Id> &)"
               );
}

Assistant:

void Converter::Impl::decorate_physical_offsets(spv::Id struct_type_id, const Vector<spv::Id> &type_ids)
{
	uint32_t offset = 0;
	int member_index = 0;
	for (auto &type_id : type_ids)
	{
		// DXIL seems to imply scalar alignment for node payload.
		// It's simple and easy, so just roll with that.
		auto size_alignment = get_physical_size_for_type(type_id);
		assert(size_alignment.size != 0);
		offset = (offset + size_alignment.alignment - 1) & ~(size_alignment.alignment - 1);
		builder().addMemberDecoration(struct_type_id, member_index, spv::DecorationOffset, offset);
		offset += size_alignment.size;
		member_index++;
	}
}